

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

void * bmp_read_pixel_data(FILE *fp,uint32_t offset,bmp_dib_header_t *dib_header,size_t *stride)

{
  int iVar1;
  size_t sVar2;
  void *buffer;
  size_t buffer_size;
  size_t *stride_local;
  bmp_dib_header_t *dib_header_local;
  uint32_t offset_local;
  FILE *fp_local;
  
  if (fp == (FILE *)0x0) {
    __assert_fail("fp",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cornerstonejs[P]charls/samples/convert.c/main.c"
                  ,0x54,
                  "void *bmp_read_pixel_data(FILE *, const uint32_t, const bmp_dib_header_t *, size_t *)"
                 );
  }
  if (dib_header == (bmp_dib_header_t *)0x0) {
    __assert_fail("dib_header",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cornerstonejs[P]charls/samples/convert.c/main.c"
                  ,0x55,
                  "void *bmp_read_pixel_data(FILE *, const uint32_t, const bmp_dib_header_t *, size_t *)"
                 );
  }
  if (stride == (size_t *)0x0) {
    __assert_fail("stride",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cornerstonejs[P]charls/samples/convert.c/main.c"
                  ,0x56,
                  "void *bmp_read_pixel_data(FILE *, const uint32_t, const bmp_dib_header_t *, size_t *)"
                 );
  }
  if (dib_header->compress_type != 0) {
    __assert_fail("dib_header->compress_type == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cornerstonejs[P]charls/samples/convert.c/main.c"
                  ,0x57,
                  "void *bmp_read_pixel_data(FILE *, const uint32_t, const bmp_dib_header_t *, size_t *)"
                 );
  }
  if (dib_header->depth != 0x18) {
    __assert_fail("dib_header->depth == 24",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cornerstonejs[P]charls/samples/convert.c/main.c"
                  ,0x58,
                  "void *bmp_read_pixel_data(FILE *, const uint32_t, const bmp_dib_header_t *, size_t *)"
                 );
  }
  iVar1 = fseek((FILE *)fp,(ulong)offset,0);
  if (iVar1 == 0) {
    *stride = (ulong)dib_header->width * 3 + 3 & 0xfffffffffffffffc;
    sVar2 = (long)dib_header->height * *stride;
    fp_local = (FILE *)malloc(sVar2);
    if (fp_local == (FILE *)0x0) {
      fp_local = (FILE *)0x0;
    }
    else {
      sVar2 = fread(fp_local,sVar2,1,(FILE *)fp);
      if (sVar2 != 1) {
        free(fp_local);
        fp_local = (FILE *)0x0;
      }
    }
  }
  else {
    fp_local = (FILE *)0x0;
  }
  return fp_local;
}

Assistant:

static void* bmp_read_pixel_data(FILE* fp, const uint32_t offset, const bmp_dib_header_t* dib_header, size_t* stride)
{
    assert(fp);
    assert(dib_header);
    assert(stride);
    assert(dib_header->compress_type == 0);
    assert(dib_header->depth == 24);

    if (fseek(fp, (long)offset, SEEK_SET))
        return NULL;

    // The BMP format requires that the size of each row is rounded up to a multiple of 4 bytes by padding.
    *stride = ((dib_header->width * bytes_per_rgb_pixel) + 3) / 4 * 4;

    const size_t buffer_size = (size_t)dib_header->height * *stride;
    void* buffer = malloc(buffer_size);
    if (!buffer)
        return NULL;

    if (fread(buffer, buffer_size, 1, fp) != 1)
    {
        free(buffer);
        return NULL;
    }

    return buffer;
}